

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
BpTree<int>::FindLess
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          BpTree<int> *this,int k,bool EQ)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  pointer pcVar3;
  int iVar4;
  size_t __n;
  ulong uVar5;
  long lVar6;
  IndexNode<int> C;
  IndexNode<int> local_f0;
  char local_90;
  vector<int,_std::allocator<int>_> local_88;
  _Vector_base<char,_std::allocator<char>_> local_70;
  vector<Addr,_std::allocator<Addr>_> local_58;
  Addr local_40;
  Addr AStack_38;
  
  IndexNode<int>::IndexNode(&local_f0,this->N);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((this->RootAddr).FileOff != -1) {
    FindNode(this,this->RootAddr,&local_f0);
    while( true ) {
      local_90 = local_f0.NodeState;
      std::vector<int,_std::allocator<int>_>::vector(&local_88,&local_f0.k);
      local_70._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_70._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_70._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
                (&local_70,
                 (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
      pcVar3 = local_70._M_impl.super__Vector_impl_data._M_start;
      __n = (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      if (__n != 0) {
        memmove(local_70._M_impl.super__Vector_impl_data._M_start,
                local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,__n);
      }
      local_70._M_impl.super__Vector_impl_data._M_finish = pcVar3 + __n;
      std::vector<Addr,_std::allocator<Addr>_>::vector(&local_58,&local_f0.p);
      cVar2 = local_90;
      local_40 = local_f0.parent;
      AStack_38 = local_f0.self;
      if (local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_70._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70._M_impl.super__Vector_impl_data._M_start,
                        (long)local_70._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (cVar2 == '1') break;
      FindNode(this,*local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_f0);
    }
LAB_0012a0e2:
    if (EQ) {
      uVar5 = 0;
      if (1 < this->N) {
        lVar6 = 0;
        uVar5 = 0;
        do {
          if ((local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5] != '1') ||
             (k < local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5])) break;
          std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
          _M_insert_unique<Addr_const&>
                    ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>
                      *)__return_storage_ptr__,
                     (Addr *)((long)&(local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->BlockNum + lVar6));
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 8;
        } while ((long)uVar5 < (long)this->N + -1);
      }
      if (k < local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5 & 0xffffffff]) goto LAB_0012a1ea;
    }
    else {
      uVar5 = 0;
      if (1 < this->N) {
        lVar6 = 0;
        uVar5 = 0;
        do {
          if ((local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5] != '1') ||
             (k <= local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar5])) break;
          std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
          _M_insert_unique<Addr_const&>
                    ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>
                      *)__return_storage_ptr__,
                     (Addr *)((long)&(local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->BlockNum + lVar6));
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 8;
        } while ((long)uVar5 < (long)this->N + -1);
      }
      if (k <= local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5 & 0xffffffff]) goto LAB_0012a1ea;
    }
    iVar4 = this->N + -1;
    if ((((int)uVar5 == iVar4) ||
        (local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar5 & 0xffffffff] == '0')) &&
       (local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start[(long)this->N + -1].FileOff == -1)) goto LAB_0012a1ea;
    if (((int)uVar5 == iVar4) ||
       (local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar5 & 0xffffffff] == '0')) {
      FindNode(this,local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar4],&local_f0);
    }
    goto LAB_0012a0e2;
  }
LAB_0012a1ea:
  if (local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (Addr *)0x0) {
    operator_delete(local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

set<Addr> BpTree<K>::FindLess(K k, bool EQ) {
	IndexNode<K> C(N);
	set<Addr> ret;
	int i, pos = 0;
	if (this->RootAddr.FileOff == -1)
		return ret;
	this->FindNode(this->RootAddr, C);
	while (!this->IsLeaf(C)) {
		this->FindNode(C.p[0], C);
	}
	while (1) {
		if (EQ == false) {
			for (i = pos; i < N - 1 && C.v[i] == '1' && C.k[i] < k; i++) {
				ret.insert(C.p[i]);
			}
			if (C.k[i] >= k) {
				break;
			}
		}
		else {
			for (i = pos; i < N - 1 && C.v[i] == '1' && C.k[i] <= k; i++) {
				ret.insert(C.p[i]);
			}
			if (C.k[i] > k) {
				break;
			}
		}
		if ((i == N - 1 || C.v[i] == '0') && C.p[N - 1].FileOff == -1) {
			break;
		}
		else if (i == N - 1 || C.v[i] == '0') {
			pos = 0;
			this->FindNode(C.p[N - 1], C);
		}
	}
	return ret;
}